

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseBlanketJSCoverage.cxx
# Opt level: O0

bool __thiscall cmParseBlanketJSCoverage::ReadJSONFile(cmParseBlanketJSCoverage *this,string *file)

{
  cmCTest *this_00;
  ostream *poVar1;
  char *msg;
  string local_1f0;
  string local_1d0 [48];
  undefined1 local_1a0 [8];
  ostringstream cmCTestLog_msg;
  undefined1 local_28 [8];
  JSONParser parser;
  string *file_local;
  cmParseBlanketJSCoverage *this_local;
  
  parser.Coverage = (cmCTestCoverageHandlerContainer *)file;
  JSONParser::JSONParser((JSONParser *)local_28,this->Coverage);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  poVar1 = std::operator<<((ostream *)local_1a0,"Parsing ");
  poVar1 = std::operator<<(poVar1,(string *)file);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  this_00 = this->CTest;
  std::__cxx11::ostringstream::str();
  msg = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(this_00,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmParseBlanketJSCoverage.cxx"
               ,0xa1,msg,(bool)(this->Coverage->Quiet & 1));
  std::__cxx11::string::~string(local_1d0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  std::__cxx11::string::string((string *)&local_1f0,(string *)file);
  JSONParser::ParseFile((JSONParser *)local_28,&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  JSONParser::~JSONParser((JSONParser *)local_28);
  return true;
}

Assistant:

bool cmParseBlanketJSCoverage::ReadJSONFile(std::string file)
  {
  cmParseBlanketJSCoverage::JSONParser parser
     (this->Coverage);
  cmCTestOptionalLog(this->CTest,HANDLER_VERBOSE_OUTPUT,
       "Parsing " << file << std::endl, this->Coverage.Quiet);
  parser.ParseFile(file);
  return true;
  }